

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
luna::RuntimeException::RuntimeException(RuntimeException *this,char *module,int line,char *desc)

{
  char local_26 [2];
  int local_24;
  char *local_20;
  char *local_18;
  
  (this->super_Exception).what_._M_dataplus._M_p = (pointer)&(this->super_Exception).what_.field_2;
  (this->super_Exception).what_._M_string_length = 0;
  (this->super_Exception).what_.field_2._M_local_buf[0] = '\0';
  local_26[1] = 0x3a;
  local_26[0] = ' ';
  local_24 = line;
  local_20 = desc;
  local_18 = module;
  Exception::SetWhat<char_const*&,char,int&,char,char_const*&>
            (&this->super_Exception,&local_18,local_26 + 1,&local_24,local_26,&local_20);
  return;
}

Assistant:

RuntimeException(const char *module, int line, const char *desc)
        {
            SetWhat(module, ':', line, ' ', desc);
        }